

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O2

DatatypeValidator *
xercesc_4_0::DatatypeValidatorFactory::getBuiltInBaseValidator(DatatypeValidator *dv)

{
  DatatypeValidator *pDVar1;
  
  while( true ) {
    if (dv == (DatatypeValidator *)0x0) {
      return (DatatypeValidator *)0x0;
    }
    pDVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                       (fBuiltInRegistry,dv->fTypeLocalName);
    if (dv == pDVar1) break;
    dv = dv->fBaseValidator;
  }
  return dv;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::getBuiltInBaseValidator(const DatatypeValidator* const dv)
{
    DatatypeValidator *curdv = (DatatypeValidator*)dv;

    while (curdv)
    {
        if (curdv == getBuiltInRegistry()->get(curdv->getTypeLocalName()))
            return curdv;
        else
            curdv = curdv->getBaseValidator();
     }

     return 0;
}